

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O1

int * Vec_MemHashLookup(Vec_Mem_t *p,word *pEntry)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint *puVar7;
  
  iVar1 = p->nEntrySize;
  if ((long)iVar1 < 1) {
    uVar3 = 0;
  }
  else {
    uVar5 = 1;
    if (1 < iVar1 * 2) {
      uVar5 = (ulong)(uint)(iVar1 * 2);
    }
    uVar6 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + *(int *)(Vec_MemHashKey_s_Primes + (ulong)((uint)uVar6 & 7) * 4) *
                      *(int *)((long)pEntry + uVar6 * 4);
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  uVar2 = p->vTable->nSize;
  uVar5 = (ulong)uVar3 % (ulong)uVar2;
  iVar4 = (int)uVar5;
  if ((-1 < iVar4) && (iVar4 < (int)uVar2)) {
    puVar7 = (uint *)(p->vTable->pArray + uVar5);
    uVar3 = *puVar7;
    if (uVar3 != 0xffffffff) {
      do {
        if (((int)uVar3 < 0) || (p->nEntries <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nEntries",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                        ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
        }
        iVar4 = bcmp(p->ppPages[uVar3 >> ((byte)p->LogPageSze & 0x1f)] +
                     (int)((p->PageMask & uVar3) * iVar1),pEntry,(long)iVar1 * 8);
        if (iVar4 == 0) {
          return (int *)puVar7;
        }
        if (p->vNexts->nSize <= (int)uVar3) goto LAB_00783c33;
        puVar7 = (uint *)(p->vNexts->pArray + uVar3);
        uVar3 = *puVar7;
      } while (uVar3 != 0xffffffff);
    }
    return (int *)puVar7;
  }
LAB_00783c33:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static int * Vec_MemHashLookup( Vec_Mem_t * p, word * pEntry )
{
    int * pSpot = Vec_IntEntryP( p->vTable, Vec_MemHashKey(p, pEntry) );
    for ( ; *pSpot != -1; pSpot = Vec_IntEntryP(p->vNexts, *pSpot) )
        if ( !memcmp( Vec_MemReadEntry(p, *pSpot), pEntry, sizeof(word) * p->nEntrySize ) ) // equal
            return pSpot;
    return pSpot;
}